

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O2

bool noui_ThreadSafeMessageBox(bilingual_str *message,string *caption,uint style)

{
  long lVar1;
  uint uVar2;
  Level level;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view source_file;
  string_view source_file_00;
  int source_line;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  string strCaption;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  strCaption._M_dataplus._M_p = (pointer)&strCaption.field_2;
  strCaption._M_string_length = 0;
  strCaption.field_2._M_local_buf[0] = '\0';
  uVar2 = style & 0xbfffffff;
  if (uVar2 == 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&strCaption,"Information: ");
    if ((style >> 0x1e & 1) != 0) goto LAB_0024cd03;
    level = Info;
    source_line = 0x27;
  }
  else if (uVar2 == 0x10000401) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&strCaption,"Warning: ");
    if ((style >> 0x1e & 1) != 0) goto LAB_0024cd03;
    level = Warning;
    source_line = 0x23;
  }
  else {
    if (uVar2 != 0x10000402) {
      std::operator+(&bStack_68,caption,": ");
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                (&strCaption,&bStack_68);
      std::__cxx11::string::~string((string *)&bStack_68);
      if ((style >> 0x1e & 1) == 0) {
        logging_function_00._M_str = "noui_ThreadSafeMessageBox";
        logging_function_00._M_len = 0x19;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/noui.cpp"
        ;
        source_file_00._M_len = 0x58;
        LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                  (logging_function_00,source_file_00,0x2b,ALL,Info,
                   (ConstevalFormatString<2U>)0x6f1bde,&strCaption,&message->original);
      }
      goto LAB_0024cd03;
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&strCaption,"Error: ");
    if ((style >> 0x1e & 1) != 0) goto LAB_0024cd03;
    level = Error;
    source_line = 0x1f;
  }
  logging_function._M_str = "noui_ThreadSafeMessageBox";
  logging_function._M_len = 0x19;
  source_file._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/noui.cpp";
  source_file._M_len = 0x58;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function,source_file,source_line,ALL,level,(ConstevalFormatString<1U>)0x723afd,
             &message->original);
LAB_0024cd03:
  tinyformat::format<std::__cxx11::string,std::__cxx11::string>
            ((ostream *)&std::cerr,"%s%s\n",&strCaption,&message->original);
  std::__cxx11::string::~string((string *)&strCaption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool noui_ThreadSafeMessageBox(const bilingual_str& message, const std::string& caption, unsigned int style)
{
    bool fSecure = style & CClientUIInterface::SECURE;
    style &= ~CClientUIInterface::SECURE;

    std::string strCaption;
    switch (style) {
    case CClientUIInterface::MSG_ERROR:
        strCaption = "Error: ";
        if (!fSecure) LogError("%s\n", message.original);
        break;
    case CClientUIInterface::MSG_WARNING:
        strCaption = "Warning: ";
        if (!fSecure) LogWarning("%s\n", message.original);
        break;
    case CClientUIInterface::MSG_INFORMATION:
        strCaption = "Information: ";
        if (!fSecure) LogInfo("%s\n", message.original);
        break;
    default:
        strCaption = caption + ": "; // Use supplied caption (can be empty)
        if (!fSecure) LogInfo("%s%s\n", strCaption, message.original);
    }

    tfm::format(std::cerr, "%s%s\n", strCaption, message.original);
    return false;
}